

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmaes.cpp
# Opt level: O0

Optimizer * createCMAES(string *configFile)

{
  Cmaes *this;
  pointer pCVar1;
  string local_30 [32];
  string *local_10;
  string *configFile_local;
  
  local_10 = configFile;
  this = (Cmaes *)operator_new(0x1c0);
  std::__cxx11::string::string(local_30,(string *)configFile);
  Cmaes::Cmaes(this,(string *)local_30);
  std::unique_ptr<Cmaes,_std::default_delete<Cmaes>_>::reset(&cmaesOptimizer,this);
  std::__cxx11::string::~string(local_30);
  pCVar1 = std::unique_ptr<Cmaes,_std::default_delete<Cmaes>_>::get(&cmaesOptimizer);
  return &pCVar1->super_Optimizer;
}

Assistant:

Optimizer* createCMAES(std::string configFile) 
{
    cmaesOptimizer.reset(new Cmaes(configFile));
    return cmaesOptimizer.get();
}